

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printRemainingMessages
          (TapAssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  ostream *poVar2;
  pointer pMVar3;
  pluralise local_58;
  ColourGuard local_40;
  
  pMVar3 = (this->itMessage)._M_current;
  pMVar1 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar3 != pMVar1) {
    poVar2 = this->stream;
    local_40.m_colourImpl = this->colourImpl;
    local_40.m_engaged = false;
    local_40.m_code = colour;
    ColourImpl::ColourGuard::engageImpl(&local_40,poVar2);
    poVar2 = std::operator<<(poVar2," with ");
    local_58.m_label.m_start = "message";
    local_58.m_label.m_size = 7;
    local_58.m_count = (uint64_t)(((long)pMVar1 - (long)pMVar3) / 0x48);
    Catch::operator<<(poVar2,&local_58);
    std::operator<<(poVar2,':');
    ColourImpl::ColourGuard::~ColourGuard(&local_40);
    while (pMVar3 = (this->itMessage)._M_current, pMVar3 != pMVar1) {
      if ((this->printInfoMessages != false) || (pMVar3->type != Info)) {
        poVar2 = std::operator<<(this->stream," \'");
        poVar2 = std::operator<<(poVar2,(string *)&((this->itMessage)._M_current)->message);
        std::operator<<(poVar2,'\'');
        pMVar3 = (this->itMessage)._M_current + 1;
        (this->itMessage)._M_current = pMVar3;
        if (pMVar3 != pMVar1) {
          poVar2 = this->stream;
          local_58.m_count = (uint64_t)this->colourImpl;
          local_58.m_label.m_start = (char *)CONCAT35(local_58.m_label.m_start._5_3_,0x17);
          ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_58,poVar2);
          std::operator<<(poVar2," and");
          ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_58);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = tapDimColour) {
                if (itMessage == messages.end()) {
                    return;
                }

                // using messages.end() directly (or auto) yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>(itEnd - itMessage);

                stream << colourImpl->guardColour( colour ) << " with "
                       << pluralise( N, "message"_sr ) << ':';

                for (; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if (printInfoMessages || itMessage->type != ResultWas::Info) {
                        stream << " '" << itMessage->message << '\'';
                        if (++itMessage != itEnd) {
                            stream << colourImpl->guardColour(tapDimColour) << " and";
                        }
                    }
                }
            }